

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(uint8_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint64_t *in_RSI;
  undefined1 *in_RDI;
  uint8_t x181;
  uint8_t x180;
  uint64_t x179;
  uint8_t x178;
  uint64_t x177;
  uint8_t x176;
  uint64_t x175;
  uint8_t x174;
  uint64_t x173;
  uint8_t x172;
  uint64_t x171;
  uint8_t x170;
  uint64_t x169;
  uint8_t x168;
  uint8_t x167;
  uint64_t x166;
  uint8_t x165;
  uint64_t x164;
  uint8_t x163;
  uint64_t x162;
  uint8_t x161;
  uint64_t x160;
  uint8_t x159;
  uint64_t x158;
  uint8_t x157;
  uint64_t x156;
  uint8_t x155;
  uint8_t x154;
  uint64_t x153;
  uint8_t x152;
  uint64_t x151;
  uint8_t x150;
  uint64_t x149;
  uint8_t x148;
  uint64_t x147;
  uint8_t x146;
  uint64_t x145;
  uint8_t x144;
  uint64_t x143;
  uint8_t x142;
  uint64_t x141;
  uint8_t x140;
  uint8_t x139;
  uint64_t x138;
  uint8_t x137;
  uint64_t x136;
  uint8_t x135;
  uint64_t x134;
  uint8_t x133;
  uint64_t x132;
  uint8_t x131;
  uint64_t x130;
  uint8_t x129;
  uint64_t x128;
  uint8_t x127;
  uint8_t x126;
  uint64_t x125;
  uint8_t x124;
  uint64_t x123;
  uint8_t x122;
  uint64_t x121;
  uint8_t x120;
  uint64_t x119;
  uint8_t x118;
  uint64_t x117;
  uint8_t x116;
  uint8_t x115;
  uint8_t x114;
  uint64_t x113;
  uint8_t x112;
  uint64_t x111;
  uint8_t x110;
  uint64_t x109;
  uint8_t x108;
  uint64_t x107;
  uint8_t x106;
  uint64_t x105;
  uint8_t x104;
  uint64_t x103;
  uint8_t x102;
  uint8_t x101;
  uint64_t x100;
  uint8_t x99;
  uint64_t x98;
  uint8_t x97;
  uint64_t x96;
  uint8_t x95;
  uint64_t x94;
  uint8_t x93;
  uint64_t x92;
  uint8_t x91;
  uint64_t x90;
  uint8_t x89;
  uint8_t x88;
  uint64_t x87;
  uint8_t x86;
  uint64_t x85;
  uint8_t x84;
  uint64_t x83;
  uint8_t x82;
  uint64_t x81;
  uint8_t x80;
  uint64_t x79;
  uint8_t x78;
  uint64_t x77;
  uint8_t x76;
  uint64_t x75;
  uint8_t x74;
  uint8_t x73;
  uint64_t x72;
  uint8_t x71;
  uint64_t x70;
  uint8_t x69;
  uint64_t x68;
  uint8_t x67;
  uint64_t x66;
  uint8_t x65;
  uint64_t x64;
  uint8_t x63;
  uint64_t x62;
  uint8_t x61;
  uint8_t x60;
  uint64_t x59;
  uint8_t x58;
  uint64_t x57;
  uint8_t x56;
  uint64_t x55;
  uint8_t x54;
  uint64_t x53;
  uint8_t x52;
  uint64_t x51;
  uint8_t x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  uint64_t x46;
  uint64_t x45;
  uint64_t x44;
  uint64_t x43;
  uint64_t x42;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x41;
  uint64_t x40;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x39;
  uint64_t x38;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x37;
  uint64_t x36;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x35;
  uint64_t x34;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x33;
  uint64_t x32;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x31;
  uint64_t x30;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x29;
  uint64_t x28;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x27;
  uint64_t x26;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x25;
  uint64_t x24;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x23;
  uint64_t x22;
  uint64_t x21;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x20;
  uint64_t x19;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x18;
  uint64_t x17;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x16;
  uint64_t x15;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x14;
  uint64_t x13;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x12;
  uint64_t x11;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x10;
  uint64_t x9;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x8;
  uint64_t x7;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x6;
  uint64_t x5;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x4;
  uint64_t x3;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x2;
  uint64_t x1;
  uint64_t in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  undefined8 in_stack_fffffffffffffac8;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 arg1_00;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_151;
  uint64_t local_150;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_141;
  uint64_t local_140;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_131;
  uint64_t local_130;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_121;
  uint64_t local_120;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_111;
  ulong local_110;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_101;
  uint64_t local_100;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_f1;
  uint64_t local_f0;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_e1;
  uint64_t local_e0;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_d1;
  uint64_t local_d0;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_c1;
  ulong local_c0;
  ulong local_b8;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_a9;
  uint64_t local_a8;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_99;
  uint64_t local_98;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_89;
  uint64_t local_88;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_79;
  uint64_t local_78;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_69;
  uint64_t local_68;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_59;
  uint64_t local_58;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_49;
  uint64_t local_48;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_39;
  uint64_t local_38;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_29;
  uint64_t local_28;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 local_19;
  uint64_t local_18;
  uint64_t *local_10;
  undefined1 *local_8;
  
  arg1_00 = (fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1)
            ((ulong)in_stack_fffffffffffffac8 >> 0x38);
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u52
            (&local_18,&local_19,'\0',*in_RSI,0xffffffffffdc7);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_28,&local_29,local_19,local_10[1],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_38,&local_39,local_29,local_10[2],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_48,&local_49,local_39,local_10[3],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_58,&local_59,local_49,local_10[4],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u52
            (&local_68,&local_69,local_59,local_10[5],0xfffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_78,&local_79,local_69,local_10[6],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_88,&local_89,local_79,local_10[7],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_98,&local_99,local_89,local_10[8],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51
            (&local_a8,&local_a9,local_99,local_10[9],0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),arg1_00,
             CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),in_stack_fffffffffffffab8
            );
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u52
            (&local_c0,&local_c1,'\0',local_18,local_b8 & 0xffffffffffdc7);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_d0,&local_d1,local_c1,local_28,local_b8 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_e0,&local_e1,local_d1,local_38,local_b8 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_f0,&local_f1,local_e1,local_48,local_b8 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_100,&local_101,local_f1,local_58,local_b8 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u52
            (&local_110,&local_111,local_101,local_68,local_b8 & 0xfffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_120,&local_121,local_111,local_78,local_b8 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_130,&local_131,local_121,local_88,local_b8 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_140,&local_141,local_131,local_98,local_b8 & 0x7ffffffffffff);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51
            (&local_150,&local_151,local_141,local_a8,local_b8 & 0x7ffffffffffff);
  uVar1 = local_d0 * 0x10 + (local_c0 >> 0x30 & 0xff);
  uVar2 = local_e0 * 0x80 + (uVar1 >> 0x30 & 0xff);
  uVar3 = local_f0 * 4 + (uVar2 >> 0x38);
  lVar4 = local_100 * 0x20 + (uVar3 >> 0x30 & 0xff);
  uVar5 = local_120 * 0x10 + (local_110 >> 0x30 & 0xff);
  uVar6 = local_130 * 0x80 + (uVar5 >> 0x30 & 0xff);
  uVar7 = local_140 * 4 + (uVar6 >> 0x38);
  lVar8 = local_150 * 0x20 + (uVar7 >> 0x30 & 0xff);
  *local_8 = (char)local_c0;
  local_8[1] = (char)(local_c0 >> 8);
  local_8[2] = (char)(local_c0 >> 0x10);
  local_8[3] = (char)(local_c0 >> 0x18);
  local_8[4] = (char)(local_c0 >> 0x20);
  local_8[5] = (char)(local_c0 >> 0x28);
  local_8[6] = (char)uVar1;
  local_8[7] = (char)(uVar1 >> 8);
  local_8[8] = (char)(uVar1 >> 0x10);
  local_8[9] = (char)(uVar1 >> 0x18);
  local_8[10] = (char)(uVar1 >> 0x20);
  local_8[0xb] = (char)(uVar1 >> 0x28);
  local_8[0xc] = (char)uVar2;
  local_8[0xd] = (char)(uVar2 >> 8);
  local_8[0xe] = (char)(uVar2 >> 0x10);
  local_8[0xf] = (char)(uVar2 >> 0x18);
  local_8[0x10] = (char)(uVar2 >> 0x20);
  local_8[0x11] = (char)(uVar2 >> 0x28);
  local_8[0x12] = (char)(uVar2 >> 0x30);
  local_8[0x13] = (char)uVar3;
  local_8[0x14] = (char)(uVar3 >> 8);
  local_8[0x15] = (char)(uVar3 >> 0x10);
  local_8[0x16] = (char)(uVar3 >> 0x18);
  local_8[0x17] = (char)(uVar3 >> 0x20);
  local_8[0x18] = (char)(uVar3 >> 0x28);
  local_8[0x19] = (char)lVar4;
  local_8[0x1a] = (char)((ulong)lVar4 >> 8);
  local_8[0x1b] = (char)((ulong)lVar4 >> 0x10);
  local_8[0x1c] = (char)((ulong)lVar4 >> 0x18);
  local_8[0x1d] = (char)((ulong)lVar4 >> 0x20);
  local_8[0x1e] = (char)((ulong)lVar4 >> 0x28);
  local_8[0x1f] = (char)((ulong)lVar4 >> 0x30);
  local_8[0x20] = (char)local_110;
  local_8[0x21] = (char)(local_110 >> 8);
  local_8[0x22] = (char)(local_110 >> 0x10);
  local_8[0x23] = (char)(local_110 >> 0x18);
  local_8[0x24] = (char)(local_110 >> 0x20);
  local_8[0x25] = (char)(local_110 >> 0x28);
  local_8[0x26] = (char)uVar5;
  local_8[0x27] = (char)(uVar5 >> 8);
  local_8[0x28] = (char)(uVar5 >> 0x10);
  local_8[0x29] = (char)(uVar5 >> 0x18);
  local_8[0x2a] = (char)(uVar5 >> 0x20);
  local_8[0x2b] = (char)(uVar5 >> 0x28);
  local_8[0x2c] = (char)uVar6;
  local_8[0x2d] = (char)(uVar6 >> 8);
  local_8[0x2e] = (char)(uVar6 >> 0x10);
  local_8[0x2f] = (char)(uVar6 >> 0x18);
  local_8[0x30] = (char)(uVar6 >> 0x20);
  local_8[0x31] = (char)(uVar6 >> 0x28);
  local_8[0x32] = (char)(uVar6 >> 0x30);
  local_8[0x33] = (char)uVar7;
  local_8[0x34] = (char)(uVar7 >> 8);
  local_8[0x35] = (char)(uVar7 >> 0x10);
  local_8[0x36] = (char)(uVar7 >> 0x18);
  local_8[0x37] = (char)(uVar7 >> 0x20);
  local_8[0x38] = (char)(uVar7 >> 0x28);
  local_8[0x39] = (char)lVar8;
  local_8[0x3a] = (char)((ulong)lVar8 >> 8);
  local_8[0x3b] = (char)((ulong)lVar8 >> 0x10);
  local_8[0x3c] = (char)((ulong)lVar8 >> 0x18);
  local_8[0x3d] = (char)((ulong)lVar8 >> 0x20);
  local_8[0x3e] = (char)((ulong)lVar8 >> 0x28);
  local_8[0x3f] = (char)((ulong)lVar8 >> 0x30);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(
    uint8_t out1[64], const uint64_t arg1[10]) {
    uint64_t x1;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x2;
    uint64_t x3;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x4;
    uint64_t x5;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x6;
    uint64_t x7;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x8;
    uint64_t x9;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x10;
    uint64_t x11;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x12;
    uint64_t x13;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x14;
    uint64_t x15;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x16;
    uint64_t x17;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x18;
    uint64_t x19;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x20;
    uint64_t x21;
    uint64_t x22;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x23;
    uint64_t x24;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x25;
    uint64_t x26;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x27;
    uint64_t x28;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x29;
    uint64_t x30;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x31;
    uint64_t x32;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x33;
    uint64_t x34;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x35;
    uint64_t x36;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x37;
    uint64_t x38;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x39;
    uint64_t x40;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint8_t x50;
    uint64_t x51;
    uint8_t x52;
    uint64_t x53;
    uint8_t x54;
    uint64_t x55;
    uint8_t x56;
    uint64_t x57;
    uint8_t x58;
    uint64_t x59;
    uint8_t x60;
    uint8_t x61;
    uint64_t x62;
    uint8_t x63;
    uint64_t x64;
    uint8_t x65;
    uint64_t x66;
    uint8_t x67;
    uint64_t x68;
    uint8_t x69;
    uint64_t x70;
    uint8_t x71;
    uint64_t x72;
    uint8_t x73;
    uint8_t x74;
    uint64_t x75;
    uint8_t x76;
    uint64_t x77;
    uint8_t x78;
    uint64_t x79;
    uint8_t x80;
    uint64_t x81;
    uint8_t x82;
    uint64_t x83;
    uint8_t x84;
    uint64_t x85;
    uint8_t x86;
    uint64_t x87;
    uint8_t x88;
    uint8_t x89;
    uint64_t x90;
    uint8_t x91;
    uint64_t x92;
    uint8_t x93;
    uint64_t x94;
    uint8_t x95;
    uint64_t x96;
    uint8_t x97;
    uint64_t x98;
    uint8_t x99;
    uint64_t x100;
    uint8_t x101;
    uint8_t x102;
    uint64_t x103;
    uint8_t x104;
    uint64_t x105;
    uint8_t x106;
    uint64_t x107;
    uint8_t x108;
    uint64_t x109;
    uint8_t x110;
    uint64_t x111;
    uint8_t x112;
    uint64_t x113;
    uint8_t x114;
    uint8_t x115;
    uint8_t x116;
    uint64_t x117;
    uint8_t x118;
    uint64_t x119;
    uint8_t x120;
    uint64_t x121;
    uint8_t x122;
    uint64_t x123;
    uint8_t x124;
    uint64_t x125;
    uint8_t x126;
    uint8_t x127;
    uint64_t x128;
    uint8_t x129;
    uint64_t x130;
    uint8_t x131;
    uint64_t x132;
    uint8_t x133;
    uint64_t x134;
    uint8_t x135;
    uint64_t x136;
    uint8_t x137;
    uint64_t x138;
    uint8_t x139;
    uint8_t x140;
    uint64_t x141;
    uint8_t x142;
    uint64_t x143;
    uint8_t x144;
    uint64_t x145;
    uint8_t x146;
    uint64_t x147;
    uint8_t x148;
    uint64_t x149;
    uint8_t x150;
    uint64_t x151;
    uint8_t x152;
    uint64_t x153;
    uint8_t x154;
    uint8_t x155;
    uint64_t x156;
    uint8_t x157;
    uint64_t x158;
    uint8_t x159;
    uint64_t x160;
    uint8_t x161;
    uint64_t x162;
    uint8_t x163;
    uint64_t x164;
    uint8_t x165;
    uint64_t x166;
    uint8_t x167;
    uint8_t x168;
    uint64_t x169;
    uint8_t x170;
    uint64_t x171;
    uint8_t x172;
    uint64_t x173;
    uint8_t x174;
    uint64_t x175;
    uint8_t x176;
    uint64_t x177;
    uint8_t x178;
    uint64_t x179;
    uint8_t x180;
    uint8_t x181;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u52(
        &x1, &x2, 0x0, (arg1[0]), UINT64_C(0xffffffffffdc7));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x3, &x4, x2, (arg1[1]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x5, &x6, x4, (arg1[2]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x7, &x8, x6, (arg1[3]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x9, &x10, x8, (arg1[4]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u52(
        &x11, &x12, x10, (arg1[5]), UINT64_C(0xfffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x13, &x14, x12, (arg1[6]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x15, &x16, x14, (arg1[7]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x17, &x18, x16, (arg1[8]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_subborrowx_u51(
        &x19, &x20, x18, (arg1[9]), UINT64_C(0x7ffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_cmovznz_u64(
        &x21, x20, 0x0, UINT64_C(0xffffffffffffffff));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u52(
        &x22, &x23, 0x0, x1, (x21 & UINT64_C(0xffffffffffdc7)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x24, &x25, x23, x3, (x21 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x26, &x27, x25, x5, (x21 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x28, &x29, x27, x7, (x21 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x30, &x31, x29, x9, (x21 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u52(
        &x32, &x33, x31, x11, (x21 & UINT64_C(0xfffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x34, &x35, x33, x13, (x21 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x36, &x37, x35, x15, (x21 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x38, &x39, x37, x17, (x21 & UINT64_C(0x7ffffffffffff)));
    fiat_id_tc26_gost_3410_2012_512_paramSetC_addcarryx_u51(
        &x40, &x41, x39, x19, (x21 & UINT64_C(0x7ffffffffffff)));
    x42 = (x40 << 5);
    x43 = (x38 << 2);
    x44 = (x36 << 7);
    x45 = (x34 << 4);
    x46 = (x30 << 5);
    x47 = (x28 << 2);
    x48 = (x26 << 7);
    x49 = (x24 << 4);
    x50 = (uint8_t)(x22 & UINT8_C(0xff));
    x51 = (x22 >> 8);
    x52 = (uint8_t)(x51 & UINT8_C(0xff));
    x53 = (x51 >> 8);
    x54 = (uint8_t)(x53 & UINT8_C(0xff));
    x55 = (x53 >> 8);
    x56 = (uint8_t)(x55 & UINT8_C(0xff));
    x57 = (x55 >> 8);
    x58 = (uint8_t)(x57 & UINT8_C(0xff));
    x59 = (x57 >> 8);
    x60 = (uint8_t)(x59 & UINT8_C(0xff));
    x61 = (uint8_t)(x59 >> 8);
    x62 = (x49 + (uint64_t)x61);
    x63 = (uint8_t)(x62 & UINT8_C(0xff));
    x64 = (x62 >> 8);
    x65 = (uint8_t)(x64 & UINT8_C(0xff));
    x66 = (x64 >> 8);
    x67 = (uint8_t)(x66 & UINT8_C(0xff));
    x68 = (x66 >> 8);
    x69 = (uint8_t)(x68 & UINT8_C(0xff));
    x70 = (x68 >> 8);
    x71 = (uint8_t)(x70 & UINT8_C(0xff));
    x72 = (x70 >> 8);
    x73 = (uint8_t)(x72 & UINT8_C(0xff));
    x74 = (uint8_t)(x72 >> 8);
    x75 = (x48 + (uint64_t)x74);
    x76 = (uint8_t)(x75 & UINT8_C(0xff));
    x77 = (x75 >> 8);
    x78 = (uint8_t)(x77 & UINT8_C(0xff));
    x79 = (x77 >> 8);
    x80 = (uint8_t)(x79 & UINT8_C(0xff));
    x81 = (x79 >> 8);
    x82 = (uint8_t)(x81 & UINT8_C(0xff));
    x83 = (x81 >> 8);
    x84 = (uint8_t)(x83 & UINT8_C(0xff));
    x85 = (x83 >> 8);
    x86 = (uint8_t)(x85 & UINT8_C(0xff));
    x87 = (x85 >> 8);
    x88 = (uint8_t)(x87 & UINT8_C(0xff));
    x89 = (uint8_t)(x87 >> 8);
    x90 = (x47 + (uint64_t)x89);
    x91 = (uint8_t)(x90 & UINT8_C(0xff));
    x92 = (x90 >> 8);
    x93 = (uint8_t)(x92 & UINT8_C(0xff));
    x94 = (x92 >> 8);
    x95 = (uint8_t)(x94 & UINT8_C(0xff));
    x96 = (x94 >> 8);
    x97 = (uint8_t)(x96 & UINT8_C(0xff));
    x98 = (x96 >> 8);
    x99 = (uint8_t)(x98 & UINT8_C(0xff));
    x100 = (x98 >> 8);
    x101 = (uint8_t)(x100 & UINT8_C(0xff));
    x102 = (uint8_t)(x100 >> 8);
    x103 = (x46 + (uint64_t)x102);
    x104 = (uint8_t)(x103 & UINT8_C(0xff));
    x105 = (x103 >> 8);
    x106 = (uint8_t)(x105 & UINT8_C(0xff));
    x107 = (x105 >> 8);
    x108 = (uint8_t)(x107 & UINT8_C(0xff));
    x109 = (x107 >> 8);
    x110 = (uint8_t)(x109 & UINT8_C(0xff));
    x111 = (x109 >> 8);
    x112 = (uint8_t)(x111 & UINT8_C(0xff));
    x113 = (x111 >> 8);
    x114 = (uint8_t)(x113 & UINT8_C(0xff));
    x115 = (uint8_t)(x113 >> 8);
    x116 = (uint8_t)(x32 & UINT8_C(0xff));
    x117 = (x32 >> 8);
    x118 = (uint8_t)(x117 & UINT8_C(0xff));
    x119 = (x117 >> 8);
    x120 = (uint8_t)(x119 & UINT8_C(0xff));
    x121 = (x119 >> 8);
    x122 = (uint8_t)(x121 & UINT8_C(0xff));
    x123 = (x121 >> 8);
    x124 = (uint8_t)(x123 & UINT8_C(0xff));
    x125 = (x123 >> 8);
    x126 = (uint8_t)(x125 & UINT8_C(0xff));
    x127 = (uint8_t)(x125 >> 8);
    x128 = (x45 + (uint64_t)x127);
    x129 = (uint8_t)(x128 & UINT8_C(0xff));
    x130 = (x128 >> 8);
    x131 = (uint8_t)(x130 & UINT8_C(0xff));
    x132 = (x130 >> 8);
    x133 = (uint8_t)(x132 & UINT8_C(0xff));
    x134 = (x132 >> 8);
    x135 = (uint8_t)(x134 & UINT8_C(0xff));
    x136 = (x134 >> 8);
    x137 = (uint8_t)(x136 & UINT8_C(0xff));
    x138 = (x136 >> 8);
    x139 = (uint8_t)(x138 & UINT8_C(0xff));
    x140 = (uint8_t)(x138 >> 8);
    x141 = (x44 + (uint64_t)x140);
    x142 = (uint8_t)(x141 & UINT8_C(0xff));
    x143 = (x141 >> 8);
    x144 = (uint8_t)(x143 & UINT8_C(0xff));
    x145 = (x143 >> 8);
    x146 = (uint8_t)(x145 & UINT8_C(0xff));
    x147 = (x145 >> 8);
    x148 = (uint8_t)(x147 & UINT8_C(0xff));
    x149 = (x147 >> 8);
    x150 = (uint8_t)(x149 & UINT8_C(0xff));
    x151 = (x149 >> 8);
    x152 = (uint8_t)(x151 & UINT8_C(0xff));
    x153 = (x151 >> 8);
    x154 = (uint8_t)(x153 & UINT8_C(0xff));
    x155 = (uint8_t)(x153 >> 8);
    x156 = (x43 + (uint64_t)x155);
    x157 = (uint8_t)(x156 & UINT8_C(0xff));
    x158 = (x156 >> 8);
    x159 = (uint8_t)(x158 & UINT8_C(0xff));
    x160 = (x158 >> 8);
    x161 = (uint8_t)(x160 & UINT8_C(0xff));
    x162 = (x160 >> 8);
    x163 = (uint8_t)(x162 & UINT8_C(0xff));
    x164 = (x162 >> 8);
    x165 = (uint8_t)(x164 & UINT8_C(0xff));
    x166 = (x164 >> 8);
    x167 = (uint8_t)(x166 & UINT8_C(0xff));
    x168 = (uint8_t)(x166 >> 8);
    x169 = (x42 + (uint64_t)x168);
    x170 = (uint8_t)(x169 & UINT8_C(0xff));
    x171 = (x169 >> 8);
    x172 = (uint8_t)(x171 & UINT8_C(0xff));
    x173 = (x171 >> 8);
    x174 = (uint8_t)(x173 & UINT8_C(0xff));
    x175 = (x173 >> 8);
    x176 = (uint8_t)(x175 & UINT8_C(0xff));
    x177 = (x175 >> 8);
    x178 = (uint8_t)(x177 & UINT8_C(0xff));
    x179 = (x177 >> 8);
    x180 = (uint8_t)(x179 & UINT8_C(0xff));
    x181 = (uint8_t)(x179 >> 8);
    out1[0] = x50;
    out1[1] = x52;
    out1[2] = x54;
    out1[3] = x56;
    out1[4] = x58;
    out1[5] = x60;
    out1[6] = x63;
    out1[7] = x65;
    out1[8] = x67;
    out1[9] = x69;
    out1[10] = x71;
    out1[11] = x73;
    out1[12] = x76;
    out1[13] = x78;
    out1[14] = x80;
    out1[15] = x82;
    out1[16] = x84;
    out1[17] = x86;
    out1[18] = x88;
    out1[19] = x91;
    out1[20] = x93;
    out1[21] = x95;
    out1[22] = x97;
    out1[23] = x99;
    out1[24] = x101;
    out1[25] = x104;
    out1[26] = x106;
    out1[27] = x108;
    out1[28] = x110;
    out1[29] = x112;
    out1[30] = x114;
    out1[31] = x115;
    out1[32] = x116;
    out1[33] = x118;
    out1[34] = x120;
    out1[35] = x122;
    out1[36] = x124;
    out1[37] = x126;
    out1[38] = x129;
    out1[39] = x131;
    out1[40] = x133;
    out1[41] = x135;
    out1[42] = x137;
    out1[43] = x139;
    out1[44] = x142;
    out1[45] = x144;
    out1[46] = x146;
    out1[47] = x148;
    out1[48] = x150;
    out1[49] = x152;
    out1[50] = x154;
    out1[51] = x157;
    out1[52] = x159;
    out1[53] = x161;
    out1[54] = x163;
    out1[55] = x165;
    out1[56] = x167;
    out1[57] = x170;
    out1[58] = x172;
    out1[59] = x174;
    out1[60] = x176;
    out1[61] = x178;
    out1[62] = x180;
    out1[63] = x181;
}